

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

list<CfgNode_*,_std::allocator<CfgNode_*>_> * __thiscall
CFG::nodes_abi_cxx11_(list<CfgNode_*,_std::allocator<CfgNode_*>_> *__return_storage_ptr__,CFG *this)

{
  _Base_ptr p_Var1;
  value_type local_28;
  
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
            (__return_storage_ptr__,&this->m_entryNode);
  if (this->m_exitNode != (CfgNode *)0x0) {
    std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
              (__return_storage_ptr__,&this->m_exitNode);
  }
  if (this->m_haltNode != (CfgNode *)0x0) {
    std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
              (__return_storage_ptr__,&this->m_haltNode);
  }
  for (p_Var1 = (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_28 = (value_type)p_Var1[1]._M_parent;
    std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
              (__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<CfgNode*> CFG::nodes() const {
	std::list<CfgNode*> nodes;

	nodes.push_back(m_entryNode);

	if (m_exitNode)
		nodes.push_back(m_exitNode);

	if (m_haltNode)
		nodes.push_back(m_haltNode);

	std::transform(m_nodesMap.begin(), m_nodesMap.end(),
	    std::back_inserter(nodes),
	    [](const std::map<Addr, CfgNode*>::value_type &pair) {
			return pair.second;
		}
	);

	return nodes;
}